

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsPATH::reset(gdsPATH *this)

{
  gdsPATH *this_local;
  
  this->layer = 0;
  this->dataType = 0;
  this->pathtype = 0;
  this->width = 0;
  std::vector<int,_std::allocator<int>_>::clear(&this->xCor);
  std::vector<int,_std::allocator<int>_>::clear(&this->yCor);
  this->propattr = 0;
  std::__cxx11::string::operator=((string *)&this->propvalue,"");
  return;
}

Assistant:

void gdsPATH::reset()
{
  layer = 0;
  dataType = 0;
  pathtype = 0;
  width = 0;
  xCor.clear();
  yCor.clear();
  propattr = 0;
  propvalue = "\0";
}